

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O1

unique_ptr<Catch::IStream> __thiscall Catch::makeStream(Catch *this,string *filename)

{
  byte *pbVar1;
  _Alloc_hider _Var2;
  int iVar3;
  streambuf *psVar4;
  undefined8 *puVar5;
  DebugOutStream *temp;
  long *this_00;
  string local_50;
  ReusableStringStream local_30;
  
  if ((filename->_M_string_length != 0) &&
     (iVar3 = std::__cxx11::string::compare((char *)filename), iVar3 != 0)) {
    if (*(filename->_M_dataplus)._M_p != '%') {
      puVar5 = (undefined8 *)operator_new(0x208);
      *puVar5 = &PTR__FileStream_00246c20;
      this_00 = puVar5 + 1;
      std::ofstream::ofstream(this_00);
      std::ofstream::open((char *)this_00,(_Ios_Openmode)(filename->_M_dataplus)._M_p);
      if ((*(byte *)((long)puVar5 + *(long *)(*this_00 + -0x18) + 0x28) & 5) == 0) {
        pbVar1 = (byte *)((long)puVar5 + *(long *)(*this_00 + -0x18) + 0x21);
        *pbVar1 = *pbVar1 | 0x20;
        local_50._M_dataplus._M_p = (pointer)0x0;
        *(undefined8 **)this = puVar5;
        Detail::unique_ptr<Catch::Detail::(anonymous_namespace)::FileStream>::~unique_ptr
                  ((unique_ptr<Catch::Detail::(anonymous_namespace)::FileStream> *)&local_50);
        return (unique_ptr<Catch::IStream>)(IStream *)this;
      }
      ReusableStringStream::ReusableStringStream(&local_30);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_30.m_oss,"Unable to open file: \'",0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_30.m_oss,(filename->_M_dataplus)._M_p,filename->_M_string_length);
      local_50._M_dataplus._M_p._0_1_ = 0x27;
      std::__ostream_insert<char,std::char_traits<char>>(local_30.m_oss,(char *)&local_50,1);
      std::__cxx11::stringbuf::str();
      throw_domain_error(&local_50);
    }
    iVar3 = std::__cxx11::string::compare((char *)filename);
    if (iVar3 == 0) {
      puVar5 = (undefined8 *)operator_new(0x120);
      *puVar5 = &PTR__DebugOutStream_00246af8;
      psVar4 = (streambuf *)operator_new(0x148);
      *(code **)psVar4 = sysconf;
      *(undefined8 *)(psVar4 + 8) = 0;
      *(undefined8 *)(psVar4 + 0x10) = 0;
      *(undefined8 *)(psVar4 + 0x18) = 0;
      *(undefined8 *)(psVar4 + 0x20) = 0;
      *(undefined8 *)(psVar4 + 0x28) = 0;
      *(undefined8 *)(psVar4 + 0x30) = 0;
      std::locale::locale((locale *)(psVar4 + 0x38));
      *(undefined ***)psVar4 = &PTR__StreamBufImpl_00246b40;
      *(streambuf **)(psVar4 + 0x28) = psVar4 + 0x40;
      *(streambuf **)(psVar4 + 0x20) = psVar4 + 0x40;
      *(streambuf **)(psVar4 + 0x30) = psVar4 + 0x140;
      puVar5[1] = psVar4;
      std::ostream::ostream(puVar5 + 2,psVar4);
      local_50._M_dataplus._M_p = (pointer)0x0;
      *(undefined8 **)this = puVar5;
      Detail::unique_ptr<Catch::Detail::(anonymous_namespace)::DebugOutStream>::~unique_ptr
                ((unique_ptr<Catch::Detail::(anonymous_namespace)::DebugOutStream> *)&local_50);
      return (unique_ptr<Catch::IStream>)(IStream *)this;
    }
    iVar3 = std::__cxx11::string::compare((char *)filename);
    if (iVar3 == 0) {
      puVar5 = (undefined8 *)operator_new(0x118);
      *puVar5 = &PTR__CerrStream_00246bd8;
      std::ostream::ostream(puVar5 + 1,*(streambuf **)(*(long *)(std::cerr + -0x18) + 0x24b770));
      *(undefined8 **)this = puVar5;
      return (unique_ptr<Catch::IStream>)(IStream *)this;
    }
    iVar3 = std::__cxx11::string::compare((char *)filename);
    if (iVar3 != 0) {
      ReusableStringStream::ReusableStringStream(&local_30);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_30.m_oss,"Unrecognised stream: \'",0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_30.m_oss,(filename->_M_dataplus)._M_p,filename->_M_string_length);
      local_50._M_dataplus._M_p._0_1_ = 0x27;
      std::__ostream_insert<char,std::char_traits<char>>(local_30.m_oss,(char *)&local_50,1);
      std::__cxx11::stringbuf::str();
      throw_domain_error(&local_50);
    }
  }
  Detail::make_unique<Catch::Detail::(anonymous_namespace)::CoutStream>();
  _Var2._M_p = local_50._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)0x0;
  *(pointer *)this = _Var2._M_p;
  Detail::unique_ptr<Catch::Detail::(anonymous_namespace)::CoutStream>::~unique_ptr
            ((unique_ptr<Catch::Detail::(anonymous_namespace)::CoutStream> *)&local_50);
  return (unique_ptr<Catch::IStream>)(IStream *)this;
}

Assistant:

auto makeStream( std::string const& filename ) -> Detail::unique_ptr<IStream> {
        if ( filename.empty() || filename == "-" ) {
            return Detail::make_unique<Detail::CoutStream>();
        }
        if( filename[0] == '%' ) {
            if ( filename == "%debug" ) {
                return Detail::make_unique<Detail::DebugOutStream>();
            } else if ( filename == "%stderr" ) {
                return Detail::make_unique<Detail::CerrStream>();
            } else if ( filename == "%stdout" ) {
                return Detail::make_unique<Detail::CoutStream>();
            } else {
                CATCH_ERROR( "Unrecognised stream: '" << filename << '\'' );
            }
        }
        return Detail::make_unique<Detail::FileStream>( filename );
    }